

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void geopolyBBoxFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  GeoPoly *p;
  
  p = geopolyBBox(context,*argv,(RtreeCoord *)0x0,(int *)0x0);
  if (p != (GeoPoly *)0x0) {
    setResultStrOrError(context,(char *)p->hdr,p->nVertex * 8 + 4,'\0',
                        (_func_void_void_ptr *)0xffffffffffffffff);
    sqlite3_free(p);
    return;
  }
  return;
}

Assistant:

static void geopolyBBoxFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  GeoPoly *p = geopolyBBox(context, argv[0], 0, 0);
  (void)argc;
  if( p ){
    sqlite3_result_blob(context, p->hdr,
       4+8*p->nVertex, SQLITE_TRANSIENT);
    sqlite3_free(p);
  }
}